

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

int fsnav_time_epochs_compare(fsnav_time_epoch *date1,fsnav_time_epoch *date2)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  
  iVar2 = date2->Y;
  iVar1 = date1->Y;
  bVar5 = SBORROW4(iVar1,iVar2);
  bVar4 = iVar1 - iVar2 < 0;
  bVar3 = iVar1 == iVar2;
  if (bVar3) {
    iVar2 = date2->M;
    iVar1 = date1->M;
    bVar5 = SBORROW4(iVar1,iVar2);
    bVar4 = iVar1 - iVar2 < 0;
    bVar3 = iVar1 == iVar2;
    if (bVar3) {
      iVar2 = date2->D;
      iVar1 = date1->D;
      bVar5 = SBORROW4(iVar1,iVar2);
      bVar4 = iVar1 - iVar2 < 0;
      bVar3 = iVar1 == iVar2;
      if (bVar3) {
        iVar2 = date2->h;
        iVar1 = date1->h;
        bVar5 = SBORROW4(iVar1,iVar2);
        bVar4 = iVar1 - iVar2 < 0;
        bVar3 = iVar1 == iVar2;
        if (bVar3) {
          iVar2 = date2->m;
          iVar1 = date1->m;
          bVar5 = SBORROW4(iVar1,iVar2);
          bVar4 = iVar1 - iVar2 < 0;
          bVar3 = iVar1 == iVar2;
          if (bVar3) {
            dVar6 = date1->s - date2->s;
            iVar2 = 1;
            if (dVar6 <= 3.0517578125e-05) {
              iVar2 = -(uint)(dVar6 < -3.0517578125e-05);
            }
            return iVar2;
          }
        }
      }
    }
  }
  return (uint)(!bVar3 && bVar5 == bVar4) * 2 + -1;
}

Assistant:

int fsnav_time_epochs_compare(fsnav_time_epoch* date1, fsnav_time_epoch* date2)
{
	const double time_precision = 1./(0x01<<15); // 1/32768, guaranteed non-zero in half precision

	int ix;
	double dx;

	ix = date1->Y - date2->Y; if (ix) return (ix > 0) ? 1 : -1;
	ix = date1->M - date2->M; if (ix) return (ix > 0) ? 1 : -1;
	ix = date1->D - date2->D; if (ix) return (ix > 0) ? 1 : -1;
	ix = date1->h - date2->h; if (ix) return (ix > 0) ? 1 : -1;
	ix = date1->m - date2->m; if (ix) return (ix > 0) ? 1 : -1;

	dx = date1->s - date2->s; return (dx > time_precision) ? 1 : ((dx < -time_precision) ? -1 : 0);
}